

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void doctest::anon_unknown_15::fulltext_log_assert_to_stream(ostream *s,AssertData *rb)

{
  bool bVar1;
  byte bVar2;
  Enum EVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  StringContains *pSVar9;
  
  iVar4 = (int)s;
  if ((rb->m_at & (is_throws_with|is_throws_as)) == 0) {
    Color::operator<<(s,Cyan);
    pcVar5 = assertString(rb->m_at);
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>(s,"( ",2);
    pcVar5 = rb->m_expr;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear(iVar4 + (int)s->_vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(s," ) ",3);
    Color::operator<<(s,None);
  }
  EVar3 = rb->m_at;
  if ((EVar3 & is_throws) == 0) {
    if ((~EVar3 & 0x60) == 0) {
      Color::operator<<(s,Cyan);
      pcVar5 = assertString(rb->m_at);
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(s,"( ",2);
      pcVar5 = rb->m_expr;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear(iVar4 + (int)s->_vptr_basic_ostream[-3]);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(s,", \"",3);
      if ((rb->m_exception_string).content.string.field_0.buf[0x17] < '\0') {
        pSVar9 = (StringContains *)(rb->m_exception_string).content.string.field_0.data.ptr;
      }
      else {
        pSVar9 = &rb->m_exception_string;
      }
      if (pSVar9 == (StringContains *)0x0) {
        std::ios::clear(iVar4 + (int)s->_vptr_basic_ostream[-3]);
      }
      else {
        sVar6 = strlen((char *)pSVar9);
        std::__ostream_insert<char,std::char_traits<char>>(s,(char *)pSVar9,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(s,"\", ",3);
      pcVar5 = rb->m_exception_type;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear(iVar4 + (int)s->_vptr_basic_ostream[-3]);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(s," ) ",3);
      Color::operator<<(s,None);
      if (rb->m_threw == true) {
        if (rb->m_failed == false) {
          pcVar5 = "threw as expected!\n";
          lVar7 = 0x13;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (s,"threw a DIFFERENT exception! (contents: ",0x28);
          doctest::operator<<(s,&rb->m_exception);
          pcVar5 = ")\n";
          lVar7 = 2;
        }
      }
      else {
        pcVar5 = "did NOT throw at all!\n";
        lVar7 = 0x16;
      }
      goto LAB_0011637a;
    }
    if ((EVar3 & is_throws_as) == 0) {
      if ((EVar3 & is_throws_with) != 0) {
        Color::operator<<(s,Cyan);
        pcVar5 = assertString(rb->m_at);
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,sVar6);
        std::__ostream_insert<char,std::char_traits<char>>(s,"( ",2);
        pcVar5 = rb->m_expr;
        if (pcVar5 == (char *)0x0) {
          std::ios::clear(iVar4 + (int)s->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(s,", \"",3);
        if ((rb->m_exception_string).content.string.field_0.buf[0x17] < '\0') {
          pSVar9 = (StringContains *)(rb->m_exception_string).content.string.field_0.data.ptr;
        }
        else {
          pSVar9 = &rb->m_exception_string;
        }
        if (pSVar9 == (StringContains *)0x0) {
          std::ios::clear(iVar4 + (int)s->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen((char *)pSVar9);
          std::__ostream_insert<char,std::char_traits<char>>(s,(char *)pSVar9,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(s,"\" ) ",4);
        Color::operator<<(s,None);
        pcVar8 = "threw a DIFFERENT exception: ";
        bVar2 = rb->m_failed;
        pcVar5 = "threw as expected!";
        goto LAB_00116328;
      }
      bVar1 = rb->m_threw;
      if ((char)EVar3 < '\0') {
        pcVar8 = "didn\'t throw!";
        if (bVar1 != false) {
          pcVar8 = "THREW exception: ";
        }
        sVar6 = (ulong)bVar1 * 4 + 0xd;
        goto LAB_0011634d;
      }
      pcVar5 = "is correct!\n";
      if ((rb->m_failed & 1U) != 0) {
        pcVar5 = "is NOT correct!\n";
      }
      pcVar8 = "THREW exception: ";
      if (bVar1 == false) {
        pcVar8 = pcVar5;
      }
      sVar6 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(s,pcVar8,sVar6);
      if (rb->m_threw != true) {
        std::__ostream_insert<char,std::char_traits<char>>(s,"  values: ",10);
        pcVar5 = assertString(rb->m_at);
        s = std::operator<<(s,pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(s,"( ",2);
        doctest::operator<<(s,&rb->m_decomp);
        pcVar5 = " )\n";
        lVar7 = 3;
        goto LAB_0011637a;
      }
    }
    else {
      Color::operator<<(s,Cyan);
      pcVar5 = assertString(rb->m_at);
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(s,"( ",2);
      pcVar5 = rb->m_expr;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear(iVar4 + (int)s->_vptr_basic_ostream[-3]);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(s,", ",2);
      pcVar5 = rb->m_exception_type;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear(iVar4 + (int)s->_vptr_basic_ostream[-3]);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(s," ) ",3);
      Color::operator<<(s,None);
      pcVar8 = "threw as expected!";
      bVar2 = rb->m_threw_as;
      pcVar5 = "threw a DIFFERENT exception: ";
LAB_00116328:
      if ((bVar2 & 1) != 0) {
        pcVar5 = pcVar8;
      }
      pcVar8 = "did NOT throw at all!";
      if (rb->m_threw != false) {
        pcVar8 = pcVar5;
      }
      sVar6 = strlen(pcVar8);
LAB_0011634d:
      std::__ostream_insert<char,std::char_traits<char>>(s,pcVar8,sVar6);
      Color::operator<<(s,Cyan);
    }
    doctest::operator<<(s,&rb->m_exception);
  }
  else {
    pcVar5 = "did NOT throw at all!";
    if ((ulong)rb->m_threw != 0) {
      pcVar5 = "threw as expected!";
    }
    std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,((ulong)rb->m_threw ^ 1) * 3 + 0x12)
    ;
  }
  pcVar5 = "\n";
  lVar7 = 1;
LAB_0011637a:
  std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,lVar7);
  return;
}

Assistant:

void fulltext_log_assert_to_stream(std::ostream& s, const AssertData& rb) {
        if((rb.m_at & (assertType::is_throws_as | assertType::is_throws_with)) ==
            0) //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << " ) "
                << Color::None;

        if(rb.m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            s << (rb.m_threw ? "threw as expected!" : "did NOT throw at all!") << "\n";
        } else if((rb.m_at & assertType::is_throws_as) &&
                    (rb.m_at & assertType::is_throws_with)) { //!OCLINT
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", \""
                << rb.m_exception_string.c_str()
                << "\", " << rb.m_exception_type << " ) " << Color::None;
            if(rb.m_threw) {
                if(!rb.m_failed) {
                    s << "threw as expected!\n";
                } else {
                    s << "threw a DIFFERENT exception! (contents: " << rb.m_exception << ")\n";
                }
            } else {
                s << "did NOT throw at all!\n";
            }
        } else if(rb.m_at &
                    assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", "
                << rb.m_exception_type << " ) " << Color::None
                << (rb.m_threw ? (rb.m_threw_as ? "threw as expected!" :
                                                "threw a DIFFERENT exception: ") :
                                "did NOT throw at all!")
                << Color::Cyan << rb.m_exception << "\n";
        } else if(rb.m_at &
                    assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", \""
                << rb.m_exception_string.c_str()
                << "\" ) " << Color::None
                << (rb.m_threw ? (!rb.m_failed ? "threw as expected!" :
                                                "threw a DIFFERENT exception: ") :
                                "did NOT throw at all!")
                << Color::Cyan << rb.m_exception << "\n";
        } else if(rb.m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            s << (rb.m_threw ? "THREW exception: " : "didn't throw!") << Color::Cyan
                << rb.m_exception << "\n";
        } else {
            s << (rb.m_threw ? "THREW exception: " :
                                (!rb.m_failed ? "is correct!\n" : "is NOT correct!\n"));
            if(rb.m_threw)
                s << rb.m_exception << "\n";
            else
                s << "  values: " << assertString(rb.m_at) << "( " << rb.m_decomp << " )\n";
        }
    }